

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write.c
# Opt level: O3

int archive_write_open(archive *_a,void *client_data,undefined1 *opener,
                      archive_write_callback *writer,undefined1 *closer)

{
  size_t *psVar1;
  code *pcVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  size_t *psVar6;
  archive_write *a;
  size_t sVar7;
  
  iVar3 = __archive_check_magic(_a,0xb0c5c0de,1,"archive_write_open");
  iVar4 = -0x1e;
  if (iVar3 != -0x1e) {
    archive_clear_error(_a);
    *(archive_write_callback **)&_a[1].file_count = writer;
    _a[1].compression_name = opener;
    _a[1].error = closer;
    _a[1].error_string.s = (char *)client_data;
    pcVar5 = (char *)calloc(1,0x60);
    *(archive **)(pcVar5 + 8) = _a;
    psVar1 = &_a[1].error_string.buffer_length;
    psVar6 = psVar1;
    if (_a[1].error_string.buffer_length != 0) {
      psVar6 = (size_t *)(_a[1].current_code + 0x10);
    }
    *psVar6 = (size_t)pcVar5;
    _a[1].current_code = pcVar5;
    *(code **)(pcVar5 + 0x20) = archive_write_client_open;
    *(code **)(pcVar5 + 0x28) = archive_write_client_write;
    *(code **)(pcVar5 + 0x30) = archive_write_client_close;
    pcVar2 = *(code **)(_a[1].error_string.buffer_length + 0x20);
    if (pcVar2 == (code *)0x0) {
      iVar4 = 0;
    }
    else {
      iVar4 = (*pcVar2)();
      if (iVar4 < -0x14) {
        sVar7 = *psVar1;
        do {
          if (*(code **)(sVar7 + 0x30) != (code *)0x0) {
            iVar3 = (**(code **)(sVar7 + 0x30))();
            goto LAB_00490809;
          }
          sVar7 = *(size_t *)(sVar7 + 0x10);
        } while (sVar7 != 0);
        iVar3 = 0;
LAB_00490809:
        if (iVar4 <= iVar3) {
          return iVar4;
        }
        return iVar3;
      }
    }
    _a->state = 2;
    if ((code *)_a[1].read_data_block != (code *)0x0) {
      iVar3 = (*(code *)_a[1].read_data_block)(_a);
      return iVar3;
    }
  }
  return iVar4;
}

Assistant:

int
archive_write_open(struct archive *_a, void *client_data,
    archive_open_callback *opener, archive_write_callback *writer,
    archive_close_callback *closer)
{
	struct archive_write *a = (struct archive_write *)_a;
	struct archive_write_filter *client_filter;
	int ret, r1;

	archive_check_magic(&a->archive, ARCHIVE_WRITE_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_write_open");
	archive_clear_error(&a->archive);

	a->client_writer = writer;
	a->client_opener = opener;
	a->client_closer = closer;
	a->client_data = client_data;

	client_filter = __archive_write_allocate_filter(_a);
	client_filter->open = archive_write_client_open;
	client_filter->write = archive_write_client_write;
	client_filter->close = archive_write_client_close;

	ret = __archive_write_open_filter(a->filter_first);
	if (ret < ARCHIVE_WARN) {
		r1 = __archive_write_close_filter(a->filter_first);
		return (r1 < ret ? r1 : ret);
	}

	a->archive.state = ARCHIVE_STATE_HEADER;
	if (a->format_init)
		ret = (a->format_init)(a);
	return (ret);
}